

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::walk
          (Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_> *this,
          Expression **root)

{
  TaskFunc p_Var1;
  Expression **ppEVar2;
  Task *pTVar3;
  
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<wasm::LogExecution, wasm::Visitor<wasm::LogExecution>>::walk(Expression *&) [SubType = wasm::LogExecution, VisitorType = wasm::Visitor<wasm::LogExecution>]"
                 );
  }
  pushTask(this,PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::scan,root)
  ;
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    do {
      pTVar3 = SmallVector<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task,_10UL>
               ::back(&this->stack);
      p_Var1 = pTVar3->func;
      ppEVar2 = pTVar3->currp;
      SmallVector<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task,_10UL>
      ::pop_back(&this->stack);
      this->replacep = ppEVar2;
      if (*ppEVar2 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<wasm::LogExecution, wasm::Visitor<wasm::LogExecution>>::walk(Expression *&) [SubType = wasm::LogExecution, VisitorType = wasm::Visitor<wasm::LogExecution>]"
                     );
      }
      (*p_Var1)((LogExecution *)(this[-1].stack.fixed._M_elems + 7),ppEVar2);
    } while (((long)(this->stack).flexible.
                    super__Vector_base<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->stack).flexible.
                    super__Vector_base<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0);
  }
  return;
}

Assistant:

void walk(Expression*& root) {
    assert(stack.size() == 0);
    pushTask(SubType::scan, &root);
    while (stack.size() > 0) {
      auto task = popTask();
      replacep = task.currp;
      assert(*task.currp);
      task.func(static_cast<SubType*>(this), task.currp);
    }
  }